

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_stream.cpp
# Opt level: O1

bool __thiscall StreamSong::IsPlaying(StreamSong *this)

{
  int iVar1;
  bool bVar2;
  
  if ((this->super_MusInfo).m_Status != STATE_Stopped) {
    iVar1 = (*this->m_Stream->_vptr_SoundStream[7])();
    bVar2 = (char)iVar1 == '\0';
    if (!bVar2) {
      (*(this->super_MusInfo)._vptr_MusInfo[7])(this);
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool StreamSong::IsPlaying ()
{
	if (m_Status != STATE_Stopped)
	{
		if (m_Stream->IsEnded())
		{
			Stop();
			return false;
		}
		return true;
	}
	return false;
}